

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# necro.c
# Opt level: O1

void flesh_two(CHAR_DATA *ch,CHAR_DATA *victim)

{
  CHAR_DATA *in_RDI;
  CHAR_DATA *local_68;
  char_data *local_60;
  string local_58;
  string local_38;
  
  local_68 = in_RDI;
  if (in_RDI->fighting == (CHAR_DATA *)0x0) {
    act("$n pours blood onto the floor, chanting softly in an undecipherable tongue.",in_RDI,
        (void *)0x0,(void *)0x0,0);
    act("You pour blood onto the floor, chanting softly in an arcane tongue.",local_68,(void *)0x0,
        (void *)0x0,3);
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"flesh_two","");
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"flesh_three","");
    CQueue::AddToQueue<void(*)(char_data*,char_data*),char_data*&,char_data*&>
              (&RS.Queue,3,&local_38,&local_58,flesh_three,&local_68,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    send_to_char("The unholy ritual disrupted, the harnessed energy dissipates harmlessly.\n\r",
                 in_RDI);
    local_68->disrupted = true;
  }
  return;
}

Assistant:

void flesh_two(CHAR_DATA *ch, CHAR_DATA *victim)
{
	if (ch->fighting)
	{
		send_to_char("The unholy ritual disrupted, the harnessed energy dissipates harmlessly.\n\r", ch);
		ch->disrupted = true;
		return;
	}

	act("$n pours blood onto the floor, chanting softly in an undecipherable tongue.", ch, 0, 0, TO_ROOM);
	act("You pour blood onto the floor, chanting softly in an arcane tongue.", ch, 0, 0, TO_CHAR);

	RS.Queue.AddToQueue(3, "flesh_two", "flesh_three", flesh_three, ch, victim);
}